

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

void __thiscall duckdb::AlterForeignKeyInfo::~AlterForeignKeyInfo(AlterForeignKeyInfo *this)

{
  ~AlterForeignKeyInfo(this);
  operator_delete(this);
  return;
}

Assistant:

AlterForeignKeyInfo::~AlterForeignKeyInfo() {
}